

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DependenceGraph.h
# Opt level: O2

int __thiscall dg::DependenceGraphBase::unref(DependenceGraphBase *this,bool deleteOnZero)

{
  int iVar1;
  
  iVar1 = this->refcount + -1;
  this->refcount = iVar1;
  if (iVar1 == 0 && deleteOnZero) {
    (*this->_vptr_DependenceGraphBase[1])();
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int unref(bool deleteOnZero = true) {
        --refcount;

        if (deleteOnZero && refcount == 0) {
            delete this;
            return 0;
        }

        assert(refcount >= 0 && "Negative refcount");
        return refcount;
    }